

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * operator/(Clifford *__return_storage_ptr__,float tv,Clifford *A)

{
  float tv_00;
  vector<Blade,_std::allocator<Blade>_> local_c8;
  Clifford local_b0;
  vector<Blade,_std::allocator<Blade>_> local_88;
  Clifford local_70;
  vector<Blade,_std::allocator<Blade>_> local_58;
  Clifford local_40;
  float local_24;
  Clifford *pCStack_20;
  float n;
  Clifford *A_local;
  Clifford *pCStack_10;
  float tv_local;
  
  pCStack_20 = A;
  A_local._4_4_ = tv;
  pCStack_10 = __return_storage_ptr__;
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_58,A);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_88,A);
  operator!(&local_70,&local_88);
  operator*(&local_40,&local_58,&local_70);
  operator<=(&local_24,&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_40);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_70);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_88);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_58);
  tv_00 = A_local._4_4_ / local_24;
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c8,A);
  operator!(&local_b0,&local_c8);
  operator*(__return_storage_ptr__,tv_00,&local_b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_b0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

Clifford operator/(float tv, Clifford A)
{
	float n;
	n <= (A*(!A));
	return((tv/n)*(!A));
}